

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturemanager.cpp
# Opt level: O0

bool __thiscall QGestureManager::filterEvent(QGestureManager *this,QWidget *receiver,QEvent *event)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QVarLengthArray<Qt::GestureType,_16LL> *this_00;
  QVarLengthArray<Qt::GestureType,_16LL> *key;
  QMultiMap<QObject_*,_Qt::GestureType> *in_RDX;
  QObject **in_RSI;
  long in_FS_OFFSET;
  QWidget *w;
  ContextIterator e_1;
  ContextIterator it_1;
  ContextIterator e;
  ContextIterator it;
  QMultiMap<QObject_*,_Qt::GestureType> contexts;
  QVarLengthArray<Qt::GestureType,_16LL> types;
  undefined4 in_stack_ffffffffffffff18;
  undefined2 in_stack_ffffffffffffff1c;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  QVarLengthArray<Qt::GestureType,_16LL> *in_stack_ffffffffffffff20;
  iterator in_stack_ffffffffffffff30;
  iterator in_stack_ffffffffffffff38;
  QFlagsStorageHelper<Qt::GestureFlag,_4> local_94;
  const_iterator local_90;
  const_iterator local_88;
  const_iterator local_78;
  const_iterator local_70;
  undefined1 *local_68;
  undefined1 local_60 [24];
  QEvent *in_stack_ffffffffffffffb8;
  QMultiMap<QObject_*,_Qt::GestureType> *in_stack_ffffffffffffffc0;
  QGestureManager *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_60,0xaa,0x58);
  QVarLengthArray<Qt::GestureType,_16LL>::QVarLengthArray
            ((QVarLengthArray<Qt::GestureType,_16LL> *)local_60);
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QMultiMap<QObject_*,_Qt::GestureType>::QMultiMap
            ((QMultiMap<QObject_*,_Qt::GestureType> *)0x30a3f5);
  QWidget::d_func((QWidget *)0x30a409);
  bVar2 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::isEmpty
                    ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)in_stack_ffffffffffffff20);
  if (!bVar2) {
    local_70._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::d_func((QWidget *)0x30a436);
    local_70._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constBegin
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT17(in_stack_ffffffffffffff1f,
                             CONCAT16(in_stack_ffffffffffffff1e,
                                      CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
                            ));
    local_78._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::d_func((QWidget *)0x30a460);
    local_78._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constEnd
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT17(in_stack_ffffffffffffff1f,
                             CONCAT16(in_stack_ffffffffffffff1e,
                                      CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
                            ));
    while (bVar2 = ::operator!=((const_iterator *)in_stack_ffffffffffffff20,
                                (const_iterator *)
                                CONCAT17(in_stack_ffffffffffffff1f,
                                         CONCAT16(in_stack_ffffffffffffff1e,
                                                  CONCAT24(in_stack_ffffffffffffff1c,
                                                           in_stack_ffffffffffffff18)))), bVar2) {
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                ((const_iterator *)0x30a493);
      QVarLengthArray<Qt::GestureType,_16LL>::push_back
                (in_stack_ffffffffffffff20,
                 (GestureType *)
                 CONCAT17(in_stack_ffffffffffffff1f,
                          CONCAT16(in_stack_ffffffffffffff1e,
                                   CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))));
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                ((const_iterator *)0x30a4b7);
      in_stack_ffffffffffffff38._M_node =
           (_Base_ptr)
           QMultiMap<QObject_*,_Qt::GestureType>::insert
                     (in_RDX,in_RSI,&(in_stack_ffffffffffffff38._M_node)->_M_color);
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::operator++
                ((const_iterator *)in_stack_ffffffffffffff20);
    }
  }
  bVar2 = QWidget::isWindow((QWidget *)in_stack_ffffffffffffff20);
  if (bVar2) {
    this_00 = (QVarLengthArray<Qt::GestureType,_16LL> *)0x0;
    key = this_00;
  }
  else {
    this_00 = (QVarLengthArray<Qt::GestureType,_16LL> *)QWidget::parentWidget((QWidget *)0x30a502);
    key = this_00;
  }
  while (key != (QVarLengthArray<Qt::GestureType,_16LL> *)0x0) {
    local_88._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::d_func((QWidget *)0x30a533);
    local_88._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constBegin
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT17(in_stack_ffffffffffffff1f,
                             CONCAT16(in_stack_ffffffffffffff1e,
                                      CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
                            ));
    local_90._M_node = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::d_func((QWidget *)0x30a55d);
    local_90._M_node =
         (_Base_ptr)
         QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::constEnd
                   ((QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_> *)
                    CONCAT17(in_stack_ffffffffffffff1f,
                             CONCAT16(in_stack_ffffffffffffff1e,
                                      CONCAT24(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18))
                            ));
    while (bVar2 = ::operator!=((const_iterator *)this_00,
                                (const_iterator *)
                                CONCAT17(in_stack_ffffffffffffff1f,
                                         CONCAT16(in_stack_ffffffffffffff1e,
                                                  CONCAT24(in_stack_ffffffffffffff1c,
                                                           in_stack_ffffffffffffff18)))), bVar2) {
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::value
                ((const_iterator *)0x30a593);
      local_94.super_QFlagsStorage<Qt::GestureFlag>.i =
           (QFlagsStorage<Qt::GestureFlag>)
           QFlags<Qt::GestureFlag>::operator&
                     ((QFlags<Qt::GestureFlag> *)this_00,
                      CONCAT13(in_stack_ffffffffffffff1f,
                               CONCAT12(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff1c)));
      bVar2 = QFlags<Qt::GestureFlag>::operator!((QFlags<Qt::GestureFlag> *)&local_94);
      if (bVar2) {
        QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                  ((const_iterator *)0x30a5be);
        bVar2 = QVLABase<Qt::GestureType>::contains<Qt::GestureType>
                          ((QVLABase<Qt::GestureType> *)in_stack_ffffffffffffff38._M_node,
                           &(in_stack_ffffffffffffff30._M_node)->_M_color);
        if (!bVar2) {
          QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                    ((const_iterator *)0x30a5dc);
          QVarLengthArray<Qt::GestureType,_16LL>::push_back
                    (this_00,(GestureType *)
                             CONCAT17(in_stack_ffffffffffffff1f,
                                      CONCAT16(in_stack_ffffffffffffff1e,
                                               CONCAT24(in_stack_ffffffffffffff1c,
                                                        in_stack_ffffffffffffff18))));
          QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::key
                    ((const_iterator *)0x30a600);
          in_stack_ffffffffffffff30._M_node =
               (_Base_ptr)
               QMultiMap<QObject_*,_Qt::GestureType>::insert
                         (in_RDX,(QObject **)key,&(in_stack_ffffffffffffff38._M_node)->_M_color);
        }
      }
      QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::const_iterator::operator++
                ((const_iterator *)this_00);
    }
    bVar2 = QWidget::isWindow((QWidget *)this_00);
    if (bVar2) break;
    key = (QVarLengthArray<Qt::GestureType,_16LL> *)QWidget::parentWidget((QWidget *)0x30a649);
  }
  bVar2 = QMultiMap<QObject_*,_Qt::GestureType>::isEmpty
                    ((QMultiMap<QObject_*,_Qt::GestureType> *)this_00);
  if (bVar2) {
    bVar3 = false;
  }
  else {
    bVar3 = filterEventThroughContexts
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
  }
  QMultiMap<QObject_*,_Qt::GestureType>::~QMultiMap
            ((QMultiMap<QObject_*,_Qt::GestureType> *)0x30a69e);
  QVarLengthArray<Qt::GestureType,_16LL>::~QVarLengthArray(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool QGestureManager::filterEvent(QWidget *receiver, QEvent *event)
{
    QVarLengthArray<Qt::GestureType, 16> types;
    QMultiMap<QObject *, Qt::GestureType> contexts;
    QWidget *w = receiver;
    typedef QMap<Qt::GestureType, Qt::GestureFlags>::const_iterator ContextIterator;
    if (!w->d_func()->gestureContext.isEmpty()) {
        for(ContextIterator it = w->d_func()->gestureContext.constBegin(),
            e = w->d_func()->gestureContext.constEnd(); it != e; ++it) {
            types.push_back(it.key());
            contexts.insert(w, it.key());
        }
    }
    // find all gesture contexts for the widget tree
    w = w->isWindow() ? nullptr : w->parentWidget();
    while (w)
    {
        for (ContextIterator it = w->d_func()->gestureContext.constBegin(),
             e = w->d_func()->gestureContext.constEnd(); it != e; ++it) {
            if (!(it.value() & Qt::DontStartGestureOnChildren)) {
                if (!types.contains(it.key())) {
                    types.push_back(it.key());
                    contexts.insert(w, it.key());
                }
            }
        }
        if (w->isWindow())
            break;
        w = w->parentWidget();
    }
    return contexts.isEmpty() ? false : filterEventThroughContexts(contexts, event);
}